

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btHashKey<btTriIndex>_>::~btAlignedObjectArray
          (btAlignedObjectArray<btHashKey<btTriIndex>_> *this)

{
  clear(this);
  return;
}

Assistant:

~btAlignedObjectArray()
		{
			clear();
		}